

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::UmulExtendedCase::compare
          (UmulExtendedCase *this,void **inputs,void **outputs)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = glu::getDataTypeScalarSize
                    ((((this->super_IntegerFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  do {
    if (uVar4 == uVar5) {
LAB_01275bb4:
      return (long)(int)uVar1 <= (long)uVar5;
    }
    uVar3 = (ulong)*(uint *)((long)inputs[1] + uVar5 * 4) *
            (ulong)*(uint *)((long)*inputs + uVar5 * 4);
    if ((*(int *)((long)*outputs + uVar5 * 4) != (int)(uVar3 >> 0x20)) ||
       (*(int *)((long)outputs[1] + uVar5 * 4) != (int)uVar3)) {
      poVar2 = std::operator<<(&(this->super_IntegerFunctionCase).m_failMsg.
                                super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar5);
      poVar2 = std::operator<<(poVar2,"] = ");
      poVar2 = tcu::Format::operator<<(poVar2,(Hex<8UL>)(uVar3 >> 0x20));
      poVar2 = std::operator<<(poVar2,", ");
      tcu::Format::operator<<(poVar2,(Hex<8UL>)(uVar3 & 0xffffffff));
      goto LAB_01275bb4;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint64	mul64	= deUint64(in0)*deUint64(in1);
			const deUint32	ref0	= deUint32(mul64 >> 32);
			const deUint32	ref1	= deUint32(mul64 & 0xffffffffu);

			if (out0 != ref0 || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}